

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::setHorizontalHeader(QTableView *this,QHeaderView *header)

{
  long lVar1;
  bool bVar2;
  QTableViewPrivate *pQVar3;
  iterator signal;
  QObject *pQVar4;
  QAbstractItemModel *pQVar5;
  QItemSelectionModel *pQVar6;
  QHeaderView *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  Connection *connection;
  iterator __end1;
  iterator __begin1;
  array<QMetaObject::Connection,_5UL> *__range1;
  QTableViewPrivate *d;
  undefined1 in_stack_fffffffffffffedf;
  QHeaderView *in_stack_fffffffffffffee0;
  QHeaderView *pQVar7;
  array<QMetaObject::Connection,_5UL> *in_stack_fffffffffffffee8;
  QWidget *in_stack_fffffffffffffef8;
  QWidget *in_stack_ffffffffffffff00;
  offset_in_QTableView_to_subr *in_stack_ffffffffffffff20;
  offset_in_QTableView_to_subr *slot;
  ContextType *in_stack_ffffffffffffff28;
  code *context;
  Object *in_stack_ffffffffffffff30;
  Object *sender;
  Connection *local_a8;
  ConnectionType type;
  undefined1 enable;
  QTableView *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QTableView *)0x8b27ce);
  if ((in_RSI != (QHeaderView *)0x0) && (in_RSI != pQVar3->horizontalHeader)) {
    local_a8 = std::array<QMetaObject::Connection,_5UL>::begin
                         ((array<QMetaObject::Connection,_5UL> *)0x8b2834);
    signal = std::array<QMetaObject::Connection,_5UL>::end
                       ((array<QMetaObject::Connection,_5UL> *)0x8b2849);
    for (; local_a8 != signal; local_a8 = local_a8 + 1) {
      QObject::disconnect(local_a8);
    }
    if (((pQVar3->horizontalHeader != (QHeaderView *)0x0) &&
        (pQVar4 = QObject::parent((QObject *)0x8b28bf), pQVar4 == in_RDI)) &&
       (in_stack_fffffffffffffee8 = (array<QMetaObject::Connection,_5UL> *)pQVar3->horizontalHeader,
       in_stack_fffffffffffffee8 != (array<QMetaObject::Connection,_5UL> *)0x0)) {
      (**(code **)(*(long *)&(((QAbstractItemView *)in_stack_fffffffffffffee8->_M_elems)->
                             super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x20))();
    }
    pQVar3->horizontalHeader = in_RSI;
    QWidget::setParent(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    type = (ConnectionType)in_RSI;
    QHeaderView::setFirstSectionMovable(in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
    pQVar5 = QAbstractItemView::model((QAbstractItemView *)in_RDI);
    if (pQVar5 == (QAbstractItemModel *)0x0) {
      (**(code **)(*(long *)&(pQVar3->horizontalHeader->super_QAbstractItemView).
                             super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
                (pQVar3->horizontalHeader,(pQVar3->super_QAbstractItemViewPrivate).model);
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8b298e);
      if (bVar2) {
        pQVar7 = pQVar3->horizontalHeader;
        pQVar6 = ::QPointer::operator_cast_to_QItemSelectionModel_
                           ((QPointer<QItemSelectionModel> *)0x8b29bc);
        (**(code **)(*(long *)&(pQVar7->super_QAbstractItemView).super_QAbstractScrollArea.
                               super_QFrame.super_QWidget + 0x1d0))(pQVar7,pQVar6);
      }
    }
    QObject::connect<void(QHeaderView::*)(int,int,int),void(QTableView::*)(int,int,int)>
              (in_stack_ffffffffffffff30,(offset_in_QHeaderView_to_subr)signal,
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,type);
    context = QHeaderView::sectionMoved;
    sender = (Object *)0x0;
    QObject::connect<void(QHeaderView::*)(int,int,int),void(QTableView::*)(int,int,int)>
              ((Object *)0x0,(offset_in_QHeaderView_to_subr)signal,
               (ContextType *)QHeaderView::sectionMoved,in_stack_ffffffffffffff20,type);
    slot = (offset_in_QTableView_to_subr *)0x0;
    QObject::connect<void(QHeaderView::*)(int,int),void(QTableView::*)(int,int)>
              (sender,(offset_in_QHeaderView_to_subr)signal,(ContextType *)context,
               (offset_in_QTableView_to_subr *)0x0,type);
    enable = 0;
    this_00 = (QTableView *)0x0;
    QObject::connect<void(QHeaderView::*)(int),void(QTableView::*)(int)>
              (sender,(offset_in_QHeaderView_to_subr)signal,(ContextType *)context,slot,type);
    QObject::connect<void(QHeaderView::*)(),void(QTableView::*)()>
              (sender,(offset_in_QHeaderView_to_subr)signal,(ContextType *)context,slot,type);
    std::array<QMetaObject::Connection,_5UL>::operator=
              ((array<QMetaObject::Connection,_5UL> *)in_RDI,in_stack_fffffffffffffee8);
    std::array<QMetaObject::Connection,_5UL>::~array((array<QMetaObject::Connection,_5UL> *)in_RDI);
    setSortingEnabled(this_00,(bool)enable);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::setHorizontalHeader(QHeaderView *header)
{
    Q_D(QTableView);

    if (!header || header == d->horizontalHeader)
        return;
    for (const QMetaObject::Connection &connection : d->horHeaderConnections)
        disconnect(connection);
    if (d->horizontalHeader && d->horizontalHeader->parent() == this)
        delete d->horizontalHeader;
    d->horizontalHeader = header;
    d->horizontalHeader->setParent(this);
    d->horizontalHeader->setFirstSectionMovable(true);
    if (!d->horizontalHeader->model()) {
        d->horizontalHeader->setModel(d->model);
        if (d->selectionModel)
            d->horizontalHeader->setSelectionModel(d->selectionModel);
    }

    d->horHeaderConnections = {
        connect(d->horizontalHeader,&QHeaderView::sectionResized,
                this, &QTableView::columnResized),
        connect(d->horizontalHeader, &QHeaderView::sectionMoved,
                this, &QTableView::columnMoved),
        connect(d->horizontalHeader, &QHeaderView::sectionCountChanged,
                this, &QTableView::columnCountChanged),
        connect(d->horizontalHeader, &QHeaderView::sectionHandleDoubleClicked,
                this, &QTableView::resizeColumnToContents),
        connect(d->horizontalHeader, &QHeaderView::geometriesChanged,
                this, &QTableView::updateGeometries),
    };
    //update the sorting enabled states on the new header
    setSortingEnabled(d->sortingEnabled);
}